

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

OPJ_UINT32
opj_tcd_get_decoded_tile_size(opj_tcd_t *p_tcd,OPJ_BOOL take_into_account_partial_decoding)

{
  opj_tcd_resolution_t *poVar1;
  ulong uVar2;
  uint uVar3;
  opj_tcd_resolution_t *poVar4;
  OPJ_UINT32 OVar5;
  uint uVar6;
  uint uVar7;
  OPJ_UINT32 *pOVar8;
  opj_tcd_resolution_t **ppoVar9;
  OPJ_UINT32 *pOVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  
  OVar5 = p_tcd->image->numcomps;
  pOVar10 = &p_tcd->image->comps->prec;
  ppoVar9 = &p_tcd->tcd_image->tiles->comps->resolutions;
  uVar3 = 0;
  while( true ) {
    bVar14 = OVar5 == 0;
    OVar5 = OVar5 - 1;
    if (bVar14) {
      return uVar3;
    }
    uVar6 = ((*pOVar10 >> 3) + 1) - (uint)((*pOVar10 & 7) == 0);
    if (uVar6 == 3) {
      uVar6 = 4;
    }
    poVar1 = *ppoVar9;
    uVar2 = (ulong)*(uint *)(ppoVar9 + -1);
    if ((take_into_account_partial_decoding == 0) || (p_tcd->whole_tile_decoding != 0)) {
      poVar4 = poVar1 + (uVar2 - 1);
      pOVar8 = (OPJ_UINT32 *)&poVar1[uVar2 - 1].x1;
      lVar13 = -0xbc;
      lVar12 = -0xb4;
    }
    else {
      pOVar8 = &poVar1[uVar2 - 1].win_x1;
      poVar4 = (opj_tcd_resolution_t *)&poVar1[uVar2 - 1].win_x0;
      lVar12 = -4;
      lVar13 = -0xc;
    }
    uVar7 = *pOVar8 - poVar4->x0;
    uVar11 = *(int *)((long)poVar1[uVar2].bands + lVar12 + -0x20) -
             *(int *)((long)poVar1[uVar2].bands + lVar13 + -0x20);
    if ((((uVar11 != 0) && ((int)((ulong)uVar7 * (ulong)uVar11 >> 0x20) != 0)) ||
        ((uVar11 = uVar11 * uVar7, uVar6 != 0 && ((int)((ulong)uVar6 * (ulong)uVar11 >> 0x20) != 0))
        )) || (uVar11 = uVar11 * uVar6, bVar14 = CARRY4(uVar3,uVar11), uVar3 = uVar3 + uVar11,
              bVar14)) break;
    pOVar10 = pOVar10 + 0x10;
    ppoVar9 = ppoVar9 + 0xe;
  }
  return 0xffffffff;
}

Assistant:

OPJ_UINT32 opj_tcd_get_decoded_tile_size(opj_tcd_t *p_tcd,
        OPJ_BOOL take_into_account_partial_decoding)
{
    OPJ_UINT32 i;
    OPJ_UINT32 l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tile_comp = 00;
    opj_tcd_resolution_t * l_res = 00;
    OPJ_UINT32 l_size_comp, l_remaining;
    OPJ_UINT32 l_temp;

    l_tile_comp = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;

    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        OPJ_UINT32 w, h;
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        l_res = l_tile_comp->resolutions + l_tile_comp->minimum_num_resolutions - 1;
        if (take_into_account_partial_decoding && !p_tcd->whole_tile_decoding) {
            w = l_res->win_x1 - l_res->win_x0;
            h = l_res->win_y1 - l_res->win_y0;
        } else {
            w = (OPJ_UINT32)(l_res->x1 - l_res->x0);
            h = (OPJ_UINT32)(l_res->y1 - l_res->y0);
        }
        if (h > 0 && UINT_MAX / w < h) {
            return UINT_MAX;
        }
        l_temp = w * h;
        if (l_size_comp && UINT_MAX / l_size_comp < l_temp) {
            return UINT_MAX;
        }
        l_temp *= l_size_comp;

        if (l_temp > UINT_MAX - l_data_size) {
            return UINT_MAX;
        }
        l_data_size += l_temp;
        ++l_img_comp;
        ++l_tile_comp;
    }

    return l_data_size;
}